

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

gravity_value_t convert_value2bool(gravity_vm *vm,gravity_value_t v)

{
  gravity_value_t gVar1;
  gravity_value_t gVar2;
  gravity_value_t gVar3;
  _Bool _Var4;
  int iVar5;
  gravity_class_t *pgVar6;
  gravity_closure_t *closure;
  gravity_closure_t *pgVar7;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  gravity_class_t *pgVar9;
  gravity_value_t gVar10;
  
  pgVar6 = gravity_class_bool;
  aVar8 = v.field_1;
  pgVar9 = v.isa;
  if (gravity_class_bool == pgVar9) {
    return v;
  }
  if (gravity_class_int != pgVar9) {
    if (gravity_class_float != pgVar9) {
      if (gravity_class_null != pgVar9 || (gravity_object_t *)0x1 < aVar8.p) {
        if (gravity_class_string != pgVar9) {
          pgVar6 = gravity_value_getclass(v);
          closure = gravity_vm_fastlookup(vm,pgVar6,0x1b);
          if ((closure != (gravity_closure_t *)0x0) &&
             (((closure->f->tag != EXEC_TYPE_INTERNAL ||
               ((code *)(closure->f->field_9).field_0.cpool.n != convert_object_bool)) &&
              (pgVar7 = gravity_vm_getclosure(vm), pgVar7 != closure)))) {
            _Var4 = gravity_vm_runclosure(vm,closure,v,(gravity_value_t *)0x0,0);
            if (!_Var4) {
              return (gravity_value_t)ZEXT816(0);
            }
            gVar10 = gravity_vm_result(vm);
            return gVar10;
          }
          gVar10.field_1.n = 1;
          gVar10.isa = gravity_class_bool;
          return gVar10;
        }
        if (*(int *)((long)&(aVar8.p)->identifier + 4) != 0) {
          iVar5 = strcmp((char *)(aVar8.p)->objclass,"false");
          gVar2.field_1.n._0_1_ = iVar5 != 0;
          gVar2.isa = pgVar6;
          gVar2.field_1.n._1_7_ = 0;
          return gVar2;
        }
      }
      gVar1.field_1.n = 0;
      gVar1.isa = gravity_class_bool;
      return gVar1;
    }
    aVar8.n = aVar8.n << 1;
  }
  gVar3.field_1.n._0_1_ = aVar8.n != 0;
  gVar3.isa = gravity_class_bool;
  gVar3.field_1.n._1_7_ = 0;
  return gVar3;
}

Assistant:

inline gravity_value_t convert_value2bool (gravity_vm *vm, gravity_value_t v) {
    if (VALUE_ISA_BOOL(v)) return v;

    // handle conversion for basic classes
    if (VALUE_ISA_INT(v)) return VALUE_FROM_BOOL(v.n != 0);
    if (VALUE_ISA_FLOAT(v)) return VALUE_FROM_BOOL(v.f != 0.0);
    if (VALUE_ISA_NULL(v)) return VALUE_FROM_FALSE;
    if (VALUE_ISA_UNDEFINED(v)) return VALUE_FROM_FALSE;
    if (VALUE_ISA_STRING(v)) {
        gravity_string_t *string = VALUE_AS_STRING(v);
        if (string->len == 0) return VALUE_FROM_FALSE;
        return VALUE_FROM_BOOL((strcmp(string->s, "false") != 0));
    }

    // check if class implements the Bool method
    gravity_closure_t *closure = gravity_vm_fastlookup(vm, gravity_value_getclass(v), GRAVITY_BOOL_INDEX);

    // sanity check (and break recursion)
    if ((!closure) || ((closure->f->tag == EXEC_TYPE_INTERNAL) && (closure->f->internal == convert_object_bool)) ||
        gravity_vm_getclosure(vm) == closure) return VALUE_FROM_BOOL(1);

    // execute closure and return its value
    if (gravity_vm_runclosure(vm, closure, v, NULL, 0)) return gravity_vm_result(vm);

    return VALUE_FROM_ERROR(NULL);
}